

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom
          (AnyMetadata *this,Message *message,string *type_url_prefix)

{
  ArenaStringPtr *this_00;
  int iVar1;
  string *psVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = this->type_url_;
  psVar2 = GetEmptyString_abi_cxx11_();
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
  if ((type_url_prefix->_M_string_length == 0) ||
     ((type_url_prefix->_M_dataplus)._M_p[type_url_prefix->_M_string_length - 1] != '/')) {
    std::operator+(&local_50,type_url_prefix,"/");
    std::operator+(&local_70,&local_50,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (CONCAT44(extraout_var,iVar1) + 8));
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::operator+(&local_70,type_url_prefix,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (CONCAT44(extraout_var,iVar1) + 8));
  }
  ArenaStringPtr::SetNoArena(this_00,psVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  psVar2 = ArenaStringPtr::MutableNoArena
                     (this->value_,(string *)&fixed_address_empty_string_abi_cxx11_);
  MessageLite::SerializeToString(&message->super_MessageLite,psVar2);
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message,
                           const string& type_url_prefix) {
  type_url_->SetNoArena(&::google::protobuf::internal::GetEmptyString(),
                        GetTypeUrl(message.GetDescriptor(), type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::google::protobuf::internal::GetEmptyStringAlreadyInited()));
}